

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pTVar1;
  StkId pTVar2;
  TValue *o1;
  TValue *o2;
  int i;
  int n_local;
  lua_State *to_local;
  lua_State *from_local;
  
  if (from != to) {
    from->top = from->top + -(long)n;
    for (o2._0_4_ = 0; (int)o2 < n; o2._0_4_ = (int)o2 + 1) {
      pTVar1 = from->top;
      pTVar2 = to->top;
      to->top = pTVar2 + 1;
      pTVar2->value = pTVar1[(int)o2].value;
      pTVar2->tt = pTVar1[(int)o2].tt;
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to));
  api_check(from, to->ci->top - to->top >= n);
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top++, from->top + i);
  }
  lua_unlock(to);
}